

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

SAttribute * __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::getAttributeByName
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,char *name)

{
  SAttribute *pSVar1;
  char *pcVar2;
  long lVar3;
  SAttribute *pSVar4;
  long lVar5;
  char cVar6;
  long lVar7;
  string<char> n;
  string<char> local_28;
  
  if (name == (char *)0x0) {
    pSVar4 = (SAttribute *)0x0;
  }
  else {
    local_28.array = (char *)0x0;
    local_28.allocated = 0;
    local_28.used = 0;
    core::string<char>::operator=(&local_28,name);
    lVar3 = (long)(int)(this->Attributes).used;
    if (0 < lVar3) {
      pSVar1 = (this->Attributes).data;
      lVar5 = 0;
      do {
        pcVar2 = pSVar1[lVar5].Name.array;
        cVar6 = *pcVar2;
        if (cVar6 != '\0') {
          lVar7 = 0;
          do {
            if (local_28.array[lVar7] == '\0') break;
            if (cVar6 != local_28.array[lVar7]) goto LAB_0069e5c8;
            cVar6 = pcVar2[lVar7 + 1];
            lVar7 = lVar7 + 1;
          } while (cVar6 != '\0');
        }
        pSVar4 = pSVar1 + lVar5;
        if ((pSVar4->Name).used == local_28.used) goto LAB_0069e5d2;
LAB_0069e5c8:
        lVar5 = lVar5 + 1;
      } while (lVar5 != lVar3);
    }
    pSVar4 = (SAttribute *)0x0;
LAB_0069e5d2:
    if (local_28.array != (char *)0x0) {
      operator_delete__(local_28.array);
    }
  }
  return pSVar4;
}

Assistant:

const SAttribute* getAttributeByName(const char_type* name) const
	{
		if (!name)
			return 0;

		core::string<char_type> n = name;

		for (int i=0; i<(int)Attributes.size(); ++i)
			if (Attributes[i].Name == n)
				return &Attributes[i];

		return 0;
	}